

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

int refine_cell(saucy *s,coloring *c,_func_int_saucy_ptr_coloring_ptr_int *refine)

{
  uint n;
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int i;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  if (1 < s->lev) {
    piVar1 = s->clist;
    n = s->csize;
    if ((long)(int)n < 2) {
      introsort_loop(piVar1,n,0);
    }
    else {
      iVar7 = 0;
      uVar6 = n;
      do {
        iVar7 = iVar7 + 2;
        bVar3 = 3 < uVar6;
        uVar6 = uVar6 >> 1;
      } while (bVar3);
      introsort_loop(piVar1,n,iVar7);
      uVar5 = 1;
      do {
        iVar7 = piVar1[uVar5];
        uVar8 = uVar5 & 0xffffffff;
        do {
          iVar4 = (int)uVar8;
          if (piVar1[uVar8 - 1] <= iVar7) goto LAB_002a62f3;
          piVar1[uVar8] = piVar1[uVar8 - 1];
          uVar8 = (ulong)(iVar4 - 1);
        } while (1 < iVar4);
        iVar4 = 0;
LAB_002a62f3:
        piVar1[iVar4] = iVar7;
        uVar5 = uVar5 + 1;
      } while (uVar5 != (long)(int)n);
    }
  }
  iVar7 = s->csize;
  if (iVar7 < 1) {
    iVar4 = 1;
  }
  else {
    lVar9 = 0;
    do {
      iVar4 = (*refine)(s,c,s->clist[lVar9]);
      if (iVar4 == 0) {
        iVar7 = s->csize;
        iVar4 = 0;
        break;
      }
      lVar9 = lVar9 + 1;
      iVar7 = s->csize;
    } while (lVar9 < iVar7);
  }
  if (0 < iVar7) {
    piVar1 = s->clist;
    piVar2 = s->conncnts;
    lVar9 = 0;
    do {
      piVar2[piVar1[lVar9]] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < s->csize);
  }
  s->csize = 0;
  return iVar4;
}

Assistant:

static int
refine_cell(struct saucy *s, struct coloring *c,
    int (*refine)(struct saucy *, struct coloring *, int))
{
    int i, cf, ret = 1;

    /*
     * The connected list must be consistent.  This is for
     * detecting mappings across nodes at a given level.  However,
     * at the root of the tree, we never have to map with another
     * node, so we lack this consistency constraint in that case.
     */
    if (s->lev > 1) introsort(s->clist, s->csize);

    /* Now iterate over the marked cells */
    for (i = 0; ret && i < s->csize; ++i) {
        cf = s->clist[i];
        ret = refine(s, c, cf);
    }

    /* Clear the connected marks */
    for (i = 0; i < s->csize; ++i) {
        cf = s->clist[i];
        s->conncnts[cf] = 0;
    }
    s->csize = 0;
    return ret;
}